

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pstd.h
# Opt level: O2

void __thiscall
pstd::optional<pbrt::BSDFSample>::optional
          (optional<pbrt::BSDFSample> *this,optional<pbrt::BSDFSample> *v)

{
  bool bVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  undefined8 uVar8;
  BSDFSample *pBVar9;
  
  bVar1 = v->set;
  this->set = bVar1;
  if (bVar1 == true) {
    pBVar9 = value(v);
    uVar2 = *(undefined8 *)((pBVar9->f).values.values + 2);
    uVar3 = *(undefined8 *)&(pBVar9->wi).super_Tuple3<pbrt::Vector3,_float>;
    uVar4 = *(undefined8 *)&(pBVar9->wi).super_Tuple3<pbrt::Vector3,_float>.z;
    uVar5 = *(undefined8 *)((pBVar9->f).values.values + 3);
    uVar6 = *(undefined8 *)&(pBVar9->wi).super_Tuple3<pbrt::Vector3,_float>.y;
    uVar7 = *(undefined8 *)&pBVar9->pdf;
    uVar8 = *(undefined8 *)&pBVar9->eta;
    *(undefined8 *)&this->optionalValue = *(undefined8 *)(pBVar9->f).values.values;
    *(undefined8 *)((long)&this->optionalValue + 8) = uVar2;
    *(undefined8 *)((long)&this->optionalValue + 0x10) = uVar3;
    *(undefined8 *)((long)&this->optionalValue + 0x18) = uVar4;
    *(undefined8 *)((long)&this->optionalValue + 0xc) = uVar5;
    *(undefined8 *)((long)&this->optionalValue + 0x14) = uVar6;
    *(undefined8 *)((long)&this->optionalValue + 0x1c) = uVar7;
    *(undefined8 *)((long)&this->optionalValue + 0x24) = uVar8;
    reset(v);
    return;
  }
  return;
}

Assistant:

PBRT_CPU_GPU
    bool has_value() const { return set; }